

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O0

void par_test_ansv_localidx<unsigned_long,1,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,comm *c)

{
  pointer *this;
  pointer *this_00;
  ulong uVar1;
  value_type vVar2;
  unsigned_long uVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  size_type sVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  reference pvVar11;
  reference pvVar12;
  char *expected_predicate_value;
  bool local_241;
  bool local_201;
  bool local_1c9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_188;
  string local_170;
  AssertHelper local_150;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  size_t i;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  size_t nonsv;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  lr_mins;
  vector<unsigned_long,_std::allocator<unsigned_long>_> right_nsv;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_nsv;
  size_type local_40;
  unsigned_long local_38;
  size_t prefix;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec;
  comm *c_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_local;
  
  vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)c;
  mxx::stable_distribute<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix,in,c);
  local_40 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
  local_38 = mxx::exscan<unsigned_long>
                       (&local_40,
                        (comm *)vec.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  this = &right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  this_00 = &lr_mins.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&nonsv);
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
  expected_predicate_value = (char *)0xffffffffffffffff;
  ansv<unsigned_long,1,1,1>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
             (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)&nonsv,
             (comm *)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,0xffffffffffffffff);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
  sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1c9 = false;
  if (sVar7 == sVar8) {
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &lr_mins.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1c9 = sVar7 == sVar8;
  }
  bVar5 = mxx::all_of(local_1c9,
                      (comm *)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_b0,bVar5);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar5) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_b0,
               (AssertionResult *)
               "mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c)",
               "false","true",expected_predicate_value);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
               ,0xa3,pcVar9);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (bVar5) {
    for (gtest_ar__1.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar4.ptr_ = gtest_ar__1.message_.ptr_,
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix),
        sVar4.ptr_ < pbVar10;
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar__1.message_.ptr_)->field_0x1) {
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &right_nsv.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)gtest_ar__1.message_.ptr_);
      if (*pvVar11 != 0xffffffffffffffff) {
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &right_nsv.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)gtest_ar__1.message_.ptr_);
        uVar1 = *pvVar11;
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
        uVar3 = local_38;
        if (uVar1 < sVar7) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &right_nsv.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          *pvVar11 = uVar3 + *pvVar11;
        }
        else {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &right_nsv.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          uVar1 = *pvVar11;
          sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
          local_201 = false;
          if (sVar7 <= uVar1) {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &right_nsv.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)gtest_ar__1.message_.ptr_);
            uVar1 = *pvVar11;
            sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
            sVar8 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&nonsv);
            local_201 = uVar1 < sVar7 + sVar8;
          }
          testing::AssertionResult::AssertionResult((AssertionResult *)local_100,local_201);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
          if (!bVar5) {
            testing::Message::Message(&local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__2.message_,(internal *)local_100,
                       (AssertionResult *)
                       "left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size()",
                       "false","true",expected_predicate_value);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0xb4,pcVar9);
            testing::internal::AssertHelper::operator=(&local_110,&local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
            testing::Message::~Message(&local_108);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &right_nsv.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          vVar2 = *pvVar11;
          sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
          pvVar12 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  *)&nonsv,vVar2 - sVar7);
          uVar3 = pvVar12->second;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &right_nsv.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          *pvVar11 = uVar3;
        }
      }
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &lr_mins.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)gtest_ar__1.message_.ptr_);
      if (*pvVar11 != 0xffffffffffffffff) {
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &lr_mins.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)gtest_ar__1.message_.ptr_);
        uVar1 = *pvVar11;
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
        uVar3 = local_38;
        if (uVar1 < sVar7) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &lr_mins.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          *pvVar11 = uVar3 + *pvVar11;
        }
        else {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &lr_mins.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          uVar1 = *pvVar11;
          sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
          local_241 = false;
          if (sVar7 <= uVar1) {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &lr_mins.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)gtest_ar__1.message_.ptr_);
            uVar1 = *pvVar11;
            sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
            sVar8 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&nonsv);
            local_241 = uVar1 < sVar7 + sVar8;
          }
          testing::AssertionResult::AssertionResult((AssertionResult *)local_140,local_241);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
          if (!bVar5) {
            testing::Message::Message(&local_148);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_170,(internal *)local_140,
                       (AssertionResult *)
                       "right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size()",
                       "false","true",expected_predicate_value);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0xbe,pcVar9);
            testing::internal::AssertHelper::operator=(&local_150,&local_148);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            std::__cxx11::string::~string((string *)&local_170);
            testing::Message::~Message(&local_148);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &lr_mins.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          vVar2 = *pvVar11;
          sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
          pvVar12 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  *)&nonsv,vVar2 - sVar7);
          uVar3 = pvVar12->second;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &lr_mins.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)gtest_ar__1.message_.ptr_);
          *pvVar11 = uVar3;
        }
      }
    }
    mxx::gatherv<unsigned_long>
              (&local_188,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0,
               (comm *)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_188);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_188);
    mxx::gatherv<unsigned_long>
              (&local_1a0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &lr_mins.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
               (comm *)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &lr_mins.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1a0);
    iVar6 = mxx::comm::rank((comm *)vec.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar6 == 0) {
      check_ansv<unsigned_long,1>
                (in,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    &right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,true,0xffffffffffffffff);
      check_ansv<unsigned_long,1>
                (in,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    &lr_mins.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,false,0xffffffffffffffff);
    }
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)&nonsv);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &lr_mins.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&prefix);
  return;
}

Assistant:

void par_test_ansv_localidx(const std::vector<T>& in, const mxx::comm& c) {
    std::vector<size_t> vec = mxx::stable_distribute(in, c);

    size_t prefix = mxx::exscan(vec.size(), c);

    // calc ansv
    std::vector<size_t> left_nsv;
    std::vector<size_t> right_nsv;
    std::vector<std::pair<T, size_t>> lr_mins;

    const size_t nonsv = std::numeric_limits<size_t>::max();
    ansv<T,left_type,right_type,local_indexing>(vec, left_nsv, right_nsv, lr_mins, c, nonsv);
    ASSERT_TRUE(mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c));

    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: in=" << in << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: vec=" << vec << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: left=" << left_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: right=" << right_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: lrmin=" << lr_mins << std::endl;

    // resolve local indexing into global indexing
    // FIXME: now we actually have to use a special value for non-matched
    for (size_t i = 0; i < vec.size(); ++i) {
        // resolve left
        if (left_nsv[i] != nonsv) {
            if (left_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                left_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size());
                left_nsv[i] = lr_mins[left_nsv[i]-vec.size()].second;
            }
        }
        // resolve right
        if (right_nsv[i] != nonsv) {
            if (right_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                right_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size());
                right_nsv[i] = lr_mins[right_nsv[i]-vec.size()].second;
            }
        }
    }


    left_nsv = mxx::gatherv(left_nsv, 0, c);
    right_nsv = mxx::gatherv(right_nsv, 0, c);

    if (c.rank() == 0) {
        check_ansv<T,left_type>(in, left_nsv, true, nonsv);
        check_ansv<T,right_type>(in, right_nsv, false, nonsv);
    }
}